

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<char,_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase2
               (short lhs,
               SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  char cVar1;
  bool bVar2;
  short sVar3;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDX;
  undefined1 in_SIL;
  short in_DI;
  char tmp;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *unaff_retaddr;
  char local_11;
  undefined4 in_stack_fffffffffffffff8;
  short sVar4;
  undefined1 in_stack_ffffffffffffffff;
  
  sVar4 = in_DI;
  sVar3 = std::numeric_limits<short>::min();
  if ((in_DI == sVar3) && (cVar1 = ::SafeInt::operator_cast_to_char(in_RDX), cVar1 == -1)) {
    local_11 = '\0';
    bVar2 = div_negate_min<char,_short,_false>::Value(&local_11);
    if (bVar2) {
      SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
                (unaff_retaddr,
                 (char *)CONCAT17(in_stack_ffffffffffffffff,
                                  CONCAT16(in_SIL,CONCAT24(sVar4,in_stack_fffffffffffffff8))));
      return true;
    }
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }